

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void unqliteBitvecDestroy(Bitvec *p)

{
  SyMemBackend *pBackend;
  SyMemMethods *pChunk;
  _func_void_ptr_void_ptr_uint *pChunk_00;
  void *pChunk_01;
  SyMemBackend *pAlloc;
  bitvec_rec *pRec;
  bitvec_rec *pNext;
  Bitvec *p_local;
  
  pAlloc = (SyMemBackend *)p->pList;
  pBackend = p->pAlloc;
  while (p->nRec != 0) {
    pChunk = pAlloc->pMethods;
    SyMemBackendPoolFree(pBackend,pAlloc);
    p->nRec = p->nRec - 1;
    if (p->nRec == 0) break;
    pChunk_00 = pChunk->xRealloc;
    SyMemBackendPoolFree(pBackend,pChunk);
    p->nRec = p->nRec - 1;
    if (p->nRec == 0) break;
    pChunk_01 = *(void **)(pChunk_00 + 8);
    SyMemBackendPoolFree(pBackend,pChunk_00);
    p->nRec = p->nRec - 1;
    if (p->nRec == 0) break;
    pAlloc = *(SyMemBackend **)((long)pChunk_01 + 8);
    SyMemBackendPoolFree(pBackend,pChunk_01);
    p->nRec = p->nRec - 1;
  }
  SyMemBackendFree(pBackend,p->apRec);
  SyMemBackendFree(pBackend,p);
  return;
}

Assistant:

UNQLITE_PRIVATE void unqliteBitvecDestroy(Bitvec *p)
{
	bitvec_rec *pNext,*pRec = p->pList;
	SyMemBackend *pAlloc = p->pAlloc;
	
	for(;;){
		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;

		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;


		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;


		if( p->nRec < 1 ){
			break;
		}
		pNext = pRec->pNext;
		SyMemBackendPoolFree(pAlloc,(void *)pRec);
		pRec = pNext;
		p->nRec--;
	}
	SyMemBackendFree(pAlloc,(void *)p->apRec);
	SyMemBackendFree(pAlloc,p);
}